

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::NewInnerFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,RegSlot environmentRegister,
          bool isGenerator,RegSlot homeObjLocation)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value;
  RegSlot instance;
  RegSlot homeObj;
  undefined4 *puVar3;
  uint lineNumber;
  undefined7 in_register_00000081;
  OpCode opcode;
  
  CheckOpen(this);
  value = ConsumeReg(this,destinationRegister);
  instance = ConsumeReg(this,environmentRegister);
  if ((int)CONCAT71(in_register_00000081,isGenerator) == 0) {
    if (((this->m_functionWrite->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) ==
        Flags_None) {
      opcode = (ushort)(homeObjLocation != 0xffffffff) * 4 + NewInnerScFunc;
    }
    else {
      opcode = NewInnerStackScFunc;
      if (homeObjLocation != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x934,"(!hasHomeObj)","!hasHomeObj");
        if (!bVar2) goto LAB_007d0254;
        *puVar3 = 0;
      }
    }
  }
  else {
    opcode = (ushort)(homeObjLocation != 0xffffffff) * 4 + NewInnerScGenFunc;
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x93b,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                "OpCodeAttr::HasMultiSizeLayout(opcode)");
    if (!bVar2) goto LAB_007d0254;
    *puVar3 = 0;
  }
  if (homeObjLocation == 0xffffffff) {
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    lineNumber = 0x944;
  }
  else {
    homeObj = ConsumeReg(this,homeObjLocation);
    bVar2 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,opcode,value,instance,index,homeObj);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,opcode,value,instance,index,homeObj);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                      (this,opcode,value,instance,index,homeObj);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    lineNumber = 0x940;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,lineNumber,"(success)","success");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
LAB_007d0254:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::NewInnerFunction(RegSlot destinationRegister, uint index, RegSlot environmentRegister, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;

        destinationRegister = ConsumeReg(destinationRegister);
        environmentRegister = ConsumeReg(environmentRegister);
        OpCode opcode = OpCode::NewInnerScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewInnerScGenFuncHomeObj : OpCode::NewInnerScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewInnerStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewInnerScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlotI3, opcode, destinationRegister, environmentRegister, index, homeObjLocation);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, environmentRegister, index);
        }
    }